

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int verify_bit;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  undefined1 uVar4;
  uint in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint32_t local_30;
  int local_2c;
  uint local_28;
  uint local_24;
  
  local_24 = 0xffffffff;
  local_2c = 1;
  local_30 = 0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xa9,"test condition failed: wnaf != NULL");
    abort();
  }
  uVar4 = in_ESI < 0x101;
  if (!(bool)uVar4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xaa,"test condition failed: 0 <= len && len <= 256");
    abort();
  }
  if (in_RDX == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xab,"test condition failed: a != NULL");
    abort();
  }
  uVar3 = 1 < in_ECX && in_ECX < 0x20;
  if (1 >= in_ECX || in_ECX >= 0x20) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xac,"test condition failed: 2 <= w && w <= 31");
    abort();
  }
  for (local_28 = 0; (int)local_28 < (int)in_ESI; local_28 = local_28 + 1) {
    *(undefined4 *)(in_RDI + (long)(int)local_28 * 4) = 0;
  }
  uVar1 = secp256k1_scalar_get_bits_limb32
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc4,
                     CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc0)));
  if (uVar1 != 0) {
    secp256k1_scalar_negate
              ((secp256k1_scalar *)
               CONCAT44(in_stack_ffffffffffffffc4,
                        CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc0))),
               (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_2c = -1;
  }
  local_28 = 0;
  while ((int)local_28 < (int)in_ESI) {
    uVar1 = secp256k1_scalar_get_bits_limb32
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc4,
                       CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc0)));
    if (uVar1 == local_30) {
      local_28 = local_28 + 1;
    }
    else {
      in_stack_ffffffffffffffcc = in_ECX;
      if ((int)(in_ESI - local_28) < in_ECX) {
        in_stack_ffffffffffffffcc = in_ESI - local_28;
      }
      uVar1 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)
                         CONCAT44(in_stack_ffffffffffffffc4,
                                  CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc0))),
                         in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      iVar2 = uVar1 + local_30;
      local_30 = iVar2 >> ((byte)in_ECX - 1 & 0x1f) & 1;
      in_stack_ffffffffffffffc8 = iVar2 - (local_30 << ((byte)in_ECX & 0x1f));
      *(int *)(in_RDI + (long)(int)local_28 * 4) = local_2c * in_stack_ffffffffffffffc8;
      local_24 = local_28;
      local_28 = in_stack_ffffffffffffffcc + local_28;
    }
  }
  if (local_30 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
            ,0xd4,"test condition failed: carry == 0");
    abort();
  }
  while( true ) {
    if (0xff < (int)local_28) {
      return local_24 + 1;
    }
    uVar1 = secp256k1_scalar_get_bits_limb32
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),local_28,
                       CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffffc0)));
    if (uVar1 != 0) break;
    local_28 = local_28 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
          ,0xd7,"test condition failed: secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0");
  abort();
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}